

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O2

bool __thiscall
FlowGraph::CheckIfEarlyExitAndAddEdgeToFinally
          (FlowGraph *this,BranchInstr *leaveInstr,Region *currentRegion,Region *branchTargetRegion,
          Instr **instrPrev,LabelInstr **exitLabel)

{
  RegionType RVar1;
  code *pcVar2;
  bool bVar3;
  Instr *this_00;
  BranchInstr *pBVar4;
  undefined4 *puVar5;
  LabelInstr *pLVar6;
  
  if ((SList<IR::LabelInstr_*,_Memory::ArenaAllocator,_RealCount> *)
      (this->finallyLabelStack->super_SListBase<IR::LabelInstr_*,_Memory::ArenaAllocator,_RealCount>
      ).super_SListNodeBase<Memory::ArenaAllocator>.next != this->finallyLabelStack) {
    RVar1 = currentRegion->type;
    if (RVar1 != RegionTypeFinally) {
      if (RVar1 == RegionTypeCatch) {
        return false;
      }
      if (RVar1 == RegionTypeTry) {
        if (currentRegion->matchingCatchRegion == (Region *)0x0) {
          if (currentRegion->matchingFinallyOnNoExceptRegion == branchTargetRegion) {
            return false;
          }
          if (currentRegion->matchingFinallyOnExceptRegion == branchTargetRegion) {
            return false;
          }
        }
        else {
          this_00 = IR::Instr::GetNextRealInstr(&leaveInstr->m_branchTarget->super_Instr);
          if (this_00->m_opcode == Br) {
            pBVar4 = IR::Instr::AsBranchInstr(this_00);
            *instrPrev = &pBVar4->super_Instr;
            return false;
          }
        }
      }
      else {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar5 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                           ,0x96,"(currentRegion->GetType() == RegionTypeFinally)",
                           "currentRegion->GetType() == RegionTypeFinally");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar5 = 0;
      }
    }
    bVar3 = DoesExitLabelDominate(this,leaveInstr);
    if (!bVar3) {
      pLVar6 = DeleteLeaveChainBlocks(this,leaveInstr,instrPrev);
      *exitLabel = pLVar6;
      return true;
    }
  }
  return false;
}

Assistant:

bool FlowGraph::CheckIfEarlyExitAndAddEdgeToFinally(IR::BranchInstr *leaveInstr, Region *currentRegion, Region *branchTargetRegion, IR::Instr * &instrPrev, IR::LabelInstr * &exitLabel)
{
    if (finallyLabelStack->Empty())
    {
        return false;
    }

    if (currentRegion->GetType() == RegionTypeTry)
    {
        if (currentRegion->GetMatchingCatchRegion() == nullptr)
        {
            // try of try-finally
            bool isEarly =
                (branchTargetRegion != currentRegion->GetMatchingFinallyRegion(false) &&
                    branchTargetRegion != currentRegion->GetMatchingFinallyRegion(true));
            if (!isEarly) return false;

            if (DoesExitLabelDominate(leaveInstr)) return false;

            // Cleanup Rest of the Leave chain
            exitLabel = DeleteLeaveChainBlocks(leaveInstr, instrPrev);
            return true;
        }
        // try of try-catch

        IR::BranchInstr *leaveChain = leaveInstr;
        IR::LabelInstr * leaveTarget = leaveChain->GetTarget();
        IR::Instr *target = leaveTarget->GetNextRealInstr();
        if (target->m_opcode == Js::OpCode::Br)
        {
            IR::BranchInstr *tryExit = target->AsBranchInstr();
            instrPrev = tryExit;
            return false;
        }

        if (DoesExitLabelDominate(leaveInstr)) return false;

        // Cleanup Rest of the Leave chain
        exitLabel = DeleteLeaveChainBlocks(leaveInstr, instrPrev);
        return true;
    }
    if (currentRegion->GetType() == RegionTypeCatch)
    {
        // We don't care for early exits in catch blocks, because we bailout anyway
        return false;
    }
    Assert(currentRegion->GetType() == RegionTypeFinally);
    // All Leave's inside Finally region are early exits
    // Since we execute non-excepting Finallys in JIT now, we should convert Leave to Br
    if (DoesExitLabelDominate(leaveInstr)) return false;
    exitLabel = DeleteLeaveChainBlocks(leaveInstr, instrPrev);
    return true;
}